

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

void anon_unknown.dwarf_22bf96::AddLoadInfo(VmModule *module,VmInstruction *inst)

{
  uint uVar1;
  VmValue **ppVVar2;
  VariableData *container;
  TypeBase *pTVar3;
  long lVar4;
  LoadStoreInfo *pLVar5;
  bool bVar6;
  uint uVar7;
  VmConstant *pVVar8;
  VmConstant *pVVar9;
  VmConstant *pVVar10;
  
  uVar7 = GetAccessSize(inst);
  uVar1 = (inst->arguments).count;
  if ((uVar1 == 0) || (uVar1 == 1)) {
    __assert_fail("index < count",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x199,
                  "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]");
  }
  ppVVar2 = (inst->arguments).data;
  pVVar9 = (VmConstant *)*ppVVar2;
  pVVar8 = (VmConstant *)ppVVar2[1];
  if ((pVVar8 == (VmConstant *)0x0) || ((pVVar8->super_VmValue).typeID != 1)) {
    pVVar8 = (VmConstant *)0x0;
  }
  if (pVVar9 == (VmConstant *)0x0) {
    bVar6 = true;
    pVVar9 = (VmConstant *)0x0;
  }
  else {
    if ((pVVar9->super_VmValue).typeID != 1) {
      pVVar10 = (VmConstant *)0x0;
      bVar6 = false;
      goto LAB_0027df8b;
    }
    container = pVVar9->container;
    if (container == (VariableData *)0x0) {
      return;
    }
    if (pVVar8->iValue != 0) {
      __assert_fail("loadOffset->iValue == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0x5b0,"void (anonymous namespace)::AddLoadInfo(VmModule *, VmInstruction *)");
    }
    pTVar3 = container->type;
    if (((pTVar3 != (TypeBase *)0x0) && (pTVar3->typeID == 0x13)) &&
       (lVar4._0_4_ = pTVar3[1].typeID, lVar4._4_4_ = pTVar3[1].nameHash, 0x20 < lVar4)) {
      return;
    }
    bVar6 = HasAddressTaken(container);
    bVar6 = !bVar6;
    pVVar8 = (VmConstant *)0x0;
  }
  pVVar10 = pVVar9;
  pVVar9 = (VmConstant *)0x0;
LAB_0027df8b:
  uVar1 = (module->loadStoreInfo).count;
  if (uVar1 == (module->loadStoreInfo).max) {
    SmallArray<VmModule::LoadStoreInfo,_32U>::grow(&module->loadStoreInfo,uVar1);
  }
  pLVar5 = (module->loadStoreInfo).data;
  if (pLVar5 != (LoadStoreInfo *)0x0) {
    uVar1 = (module->loadStoreInfo).count;
    (module->loadStoreInfo).count = uVar1 + 1;
    pLVar5[uVar1].loadInst = inst;
    pLVar5[uVar1].storeInst = (VmInstruction *)0x0;
    (&pLVar5[uVar1].storeInst)[1] = (VmInstruction *)0x0;
    pLVar5[uVar1].accessSize = uVar7;
    pLVar5[uVar1].loadAddress = pVVar10;
    pLVar5[uVar1].loadPointer = &pVVar9->super_VmValue;
    pLVar5[uVar1].loadOffset = pVVar8;
    pLVar5[uVar1].storeAddress = (VmConstant *)0x0;
    (&pLVar5[uVar1].storeAddress)[1] = (VmConstant *)0x0;
    pLVar5[uVar1].storeOffset = (VmConstant *)0x0;
    pLVar5[uVar1].noLoadOrNoContainerAlias = bVar6;
    pLVar5[uVar1].noStoreOrNoContainerAlias = true;
    return;
  }
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,
                "void SmallArray<VmModule::LoadStoreInfo, 32>::push_back(const T &) [T = VmModule::LoadStoreInfo, N = 32]"
               );
}

Assistant:

void AddLoadInfo(VmModule *module, VmInstruction* inst)
	{
		VmModule::LoadStoreInfo info;

		info.loadInst = inst;

		info.accessSize = GetAccessSize(inst);

		VmValue *loadPointer = inst->arguments[0];
		VmConstant *loadOffset = getType<VmConstant>(inst->arguments[1]);

		if(VmConstant *loadAddress = getType<VmConstant>(loadPointer))
		{
			if(!loadAddress->container)
				return;

			assert(loadOffset->iValue == 0);

			// Do not track load-store into large arrays
			if(TypeArray *typeArray = getType<TypeArray>(loadAddress->container->type))
			{
				if(typeArray->length > 32)
					return;
			}

			info.loadAddress = loadAddress;
		}
		else
		{
			info.loadPointer = loadPointer;
			info.loadOffset = loadOffset;
		}

		info.noLoadOrNoContainerAlias = !(info.loadAddress || info.loadPointer) || (info.loadAddress && info.loadAddress->container && !HasAddressTaken(info.loadAddress->container));
		info.noStoreOrNoContainerAlias = !(info.storeAddress || info.storePointer) || (info.storeAddress && info.storeAddress->container && !HasAddressTaken(info.storeAddress->container));

		module->loadStoreInfo.push_back(info);
	}